

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O1

KBOOL __thiscall KDIS::PDU::Detonation_PDU::operator==(Detonation_PDU *this,Detonation_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Warfare_Header::operator!=(&this->super_Warfare_Header,&Value->super_Warfare_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Velocity,&Value->m_Velocity), !KVar1)) &&
      (KVar1 = DATA_TYPE::WorldCoordinates::operator!=
                         (&this->m_LocationWorldCoords,&Value->m_LocationWorldCoords), !KVar1)) &&
     (((KVar1 = DATA_TYPE::Descriptor::operator!=
                          ((this->m_pDescriptor).m_pRef,(Value->m_pDescriptor).m_pRef), !KVar1 &&
       (KVar1 = DATA_TYPE::Vector::operator!=
                          (&this->m_LocationEntityCoords,&Value->m_LocationEntityCoords), !KVar1))
      && ((this->m_ui8DetonationResult == Value->m_ui8DetonationResult &&
          (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams)))))) {
    bVar2 = std::operator!=(&this->m_vVariableParameters,&Value->m_vVariableParameters);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL Detonation_PDU::operator == ( const Detonation_PDU & Value ) const
{
    if( Warfare_Header::operator !=( Value ) )                       return false;
    if( m_Velocity               != Value.m_Velocity )               return false;
    if( m_LocationWorldCoords    != Value.m_LocationWorldCoords )    return false;
    if( *m_pDescriptor           != *Value.m_pDescriptor )          return false;
    if( m_LocationEntityCoords   != Value.m_LocationEntityCoords )   return false;
    if( m_ui8DetonationResult    != Value.m_ui8DetonationResult )    return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams ) return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )    return false;
    return true;
}